

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O0

void bson_iter_binary(bson_iter_t *iter,bson_subtype_t *subtype,uint32_t *binary_len,
                     uint8_t **binary)

{
  uint32_t local_2c;
  uint8_t **ppuStack_28;
  bson_subtype_t backup;
  uint8_t **binary_local;
  uint32_t *binary_len_local;
  bson_subtype_t *subtype_local;
  bson_iter_t *iter_local;
  
  ppuStack_28 = binary;
  binary_local = (uint8_t **)binary_len;
  binary_len_local = subtype;
  subtype_local = (bson_subtype_t *)iter;
  if (iter == (bson_iter_t *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
            ,0x35f,"bson_iter_binary","iter");
    abort();
  }
  if (binary != (uint8_t **)0x0 && binary_len == (uint32_t *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
            ,0x360,"bson_iter_binary","!binary || binary_len");
    abort();
  }
  if (iter->raw[iter->type] == '\x05') {
    if (subtype == (bson_subtype_t *)0x0) {
      binary_len_local = &local_2c;
    }
    *binary_len_local = (uint)iter->raw[iter->d2];
    if (ppuStack_28 != (uint8_t **)0x0) {
      *(undefined4 *)binary_local =
           *(undefined4 *)(*(undefined8 *)subtype_local + (ulong)subtype_local[6]);
      *(undefined4 *)binary_local = *(undefined4 *)binary_local;
      *ppuStack_28 = (uint8_t *)(*(undefined8 *)subtype_local + (ulong)subtype_local[8]);
      if (*binary_len_local == 2) {
        *(int *)binary_local = *(int *)binary_local + -4;
        *ppuStack_28 = *ppuStack_28 + 4;
      }
    }
  }
  else {
    if (binary != (uint8_t **)0x0) {
      *binary = (uint8_t *)0x0;
    }
    if (binary_len != (uint32_t *)0x0) {
      *binary_len = 0;
    }
    if (subtype != (bson_subtype_t *)0x0) {
      *subtype = BSON_SUBTYPE_BINARY;
    }
  }
  return;
}

Assistant:

void
bson_iter_binary (const bson_iter_t *iter, /* IN */
                  bson_subtype_t *subtype, /* OUT */
                  uint32_t *binary_len,    /* OUT */
                  const uint8_t **binary)  /* OUT */
{
   bson_subtype_t backup;

   BSON_ASSERT (iter);
   BSON_ASSERT (!binary || binary_len);

   if (ITER_TYPE (iter) == BSON_TYPE_BINARY) {
      if (!subtype) {
         subtype = &backup;
      }

      *subtype = (bson_subtype_t) * (iter->raw + iter->d2);

      if (binary) {
         memcpy (binary_len, (iter->raw + iter->d1), sizeof (*binary_len));
         *binary_len = BSON_UINT32_FROM_LE (*binary_len);
         *binary = iter->raw + iter->d3;

         if (*subtype == BSON_SUBTYPE_BINARY_DEPRECATED) {
            *binary_len -= sizeof (int32_t);
            *binary += sizeof (int32_t);
         }
      }

      return;
   }

   if (binary) {
      *binary = NULL;
   }

   if (binary_len) {
      *binary_len = 0;
   }

   if (subtype) {
      *subtype = BSON_SUBTYPE_BINARY;
   }
}